

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcRectangularTrimmedSurface::~IfcRectangularTrimmedSurface
          (IfcRectangularTrimmedSurface *this)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  
  *(undefined8 *)((long)&this[-1].Usense.field_2 + 8) = 0x955fb0;
  (this->Usense)._M_dataplus._M_p = (pointer)0x956078;
  this[-1].Vsense._M_string_length = 0x955fd8;
  *(undefined8 *)((long)&this[-1].Vsense.field_2 + 8) = 0x956000;
  *(undefined8 *)&this[-1].field_0xc0 = 0x956028;
  (this->super_IfcBoundedSurface).super_IfcSurface.super_IfcGeometricRepresentationItem.
  super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0x956050;
  if ((Out *)this->U1 != &this->U2) {
    operator_delete((undefined1 *)this->U1,(long)this->U2 + 1);
  }
  puVar1 = *(undefined1 **)&(this->super_IfcBoundedSurface).super_IfcSurface.field_0x38;
  puVar2 = &(this->super_IfcBoundedSurface).field_0x48;
  if (puVar1 != puVar2) {
    operator_delete(puVar1,*(long *)puVar2 + 1);
  }
  operator_delete((void *)((long)&this[-1].Usense.field_2 + 8),0xd0);
  return;
}

Assistant:

IfcRectangularTrimmedSurface() : Object("IfcRectangularTrimmedSurface") {}